

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86Module.c
# Opt level: O0

int init(EVP_PKEY_CTX *ctx)

{
  MCRegisterInfo *MRI;
  MCRegisterInfo *mri;
  cs_struct *ud_local;
  
  if ((*(uint *)(ctx + 4) & 0x7fffff8f) == 0) {
    MRI = (MCRegisterInfo *)(*cs_mem_malloc)(0x58);
    ARM_init(MRI);
    ARM_getRegName((cs_struct *)ctx,0);
    *(code **)(ctx + 8) = ARM_printInst;
    *(MCRegisterInfo **)(ctx + 0x10) = MRI;
    *(code **)(ctx + 0x30) = ARM_reg_name;
    *(code **)(ctx + 0x48) = ARM_get_insn_id;
    *(code **)(ctx + 0x38) = ARM_insn_name;
    *(code **)(ctx + 0x40) = ARM_group_name;
    *(code **)(ctx + 0x50) = ARM_post_printer;
    if ((*(uint *)(ctx + 4) & 0x10) == 0) {
      *(code **)(ctx + 0x18) = ARM_getInstruction;
    }
    else {
      *(code **)(ctx + 0x18) = Thumb_getInstruction;
    }
    ud_local._4_4_ = 0;
  }
  else {
    ud_local._4_4_ = 5;
  }
  return ud_local._4_4_;
}

Assistant:

static cs_err init(cs_struct *ud)
{
	MCRegisterInfo *mri;

	// verify if requested mode is valid
	if (ud->mode & ~(CS_MODE_LITTLE_ENDIAN | CS_MODE_32 | CS_MODE_64 | CS_MODE_16))
		return CS_ERR_MODE;

	mri = cs_mem_malloc(sizeof(*mri));

	X86_init(mri);

	// by default, we use Intel syntax
	ud->printer = X86_Intel_printInst;
	ud->syntax = CS_OPT_SYNTAX_INTEL;
	ud->printer_info = mri;
	ud->disasm = X86_getInstruction;
	ud->reg_name = X86_reg_name;
	ud->insn_id = X86_get_insn_id;
	ud->insn_name = X86_insn_name;
	ud->group_name = X86_group_name;
	ud->post_printer = NULL;;

	if (ud->mode == CS_MODE_64)
		ud->regsize_map = regsize_map_64;
	else
		ud->regsize_map = regsize_map_32;

	return CS_ERR_OK;
}